

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O1

void __thiscall
GlobOpt::ProcessFieldKills
          (GlobOpt *this,Instr *instr,BVSparse<Memory::JitArenaAllocator> *bv,bool inGlobOpt)

{
  SymKind SVar1;
  OpCode OVar2;
  SymID stackSymID;
  Opnd *pOVar3;
  Sym *pSVar4;
  JitArenaAllocator *pJVar5;
  code *pcVar6;
  OpndKind OVar7;
  OpndKind OVar8;
  bool bVar9;
  DWORD DVar10;
  int iVar11;
  undefined4 *puVar12;
  BVSparse<Memory::JitArenaAllocator> *pBVar13;
  SymOpnd *pSVar14;
  PropertySym *pPVar15;
  undefined4 extraout_var;
  IndirOpnd *pIVar16;
  HelperCallOpnd *pHVar17;
  uint uVar18;
  StackSym *stackSym;
  
  pBVar13 = bv;
  do {
    pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)pBVar13->head;
    if (pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_004a0c4d;
  } while (((Type *)&pBVar13->alloc)->word == 0);
  if (pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_004a0c4d:
    if (this->prePassLoop == (Loop *)0x0) {
      return;
    }
    if ((this->rootLoopPrePass->field_0x178 & 0x80) != 0) {
      return;
    }
  }
  if ((instr->m_opcode & ~ExtendedOpcodePrefix) == FromVar) {
    return;
  }
  pOVar3 = instr->m_dst;
  pBVar13 = bv;
  if (pOVar3 != (Opnd *)0x0) {
    OVar7 = IR::Opnd::GetKind(pOVar3);
    OVar8 = IR::Opnd::GetKind(pOVar3);
    if (OVar7 == OpndKindReg) {
      if (OVar8 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar9) goto LAB_004a186c;
        *puVar12 = 0;
      }
      stackSym = (StackSym *)pOVar3[1]._vptr_Opnd;
      if ((stackSym->super_Sym).m_kind == SymKindStack) {
LAB_004a0da6:
        KillLiveFields(this,stackSym,bv);
      }
    }
    else if (OVar8 == OpndKindSym) {
      OVar7 = IR::Opnd::GetKind(pOVar3);
      if (OVar7 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar9) goto LAB_004a186c;
        *puVar12 = 0;
      }
      stackSym = (StackSym *)pOVar3[1]._vptr_Opnd;
      SVar1 = (stackSym->super_Sym).m_kind;
      if (SVar1 != SymKindProperty) {
        if (SVar1 == SymKindStack) goto LAB_004a0da6;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                           ,0x144,"(sym->IsPropertySym())","sym->IsPropertySym()");
        if (!bVar9) goto LAB_004a186c;
        *puVar12 = 0;
      }
      uVar18 = instr->m_opcode - 0x53;
      if ((uVar18 < 0x28) && ((0x8000000005U >> ((ulong)uVar18 & 0x3f) & 1) != 0)) {
        pPVar15 = Sym::AsPropertySym((Sym *)stackSym);
        stackSymID = (pPVar15->m_stackSym->super_Sym).m_id;
        DVar10 = Js::DynamicObject::GetOffsetOfAuxSlots();
        pPVar15 = PropertySym::Find(stackSymID,DVar10 >> 3,instr->m_func);
        if (pPVar15 != (PropertySym *)0x0) {
          BVSparse<Memory::JitArenaAllocator>::Clear(bv,(pPVar15->super_Sym).m_id);
        }
      }
    }
  }
  do {
    pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)pBVar13->head;
    if (pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_004a0dc9;
  } while (((Type *)&pBVar13->alloc)->word == 0);
  if (pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_004a0dc9:
    if (this->prePassLoop == (Loop *)0x0) {
      return;
    }
    if ((this->rootLoopPrePass->field_0x178 & 0x80) != 0) {
      return;
    }
  }
  OVar2 = instr->m_opcode;
  uVar18 = (uint)OVar2;
  if (OVar2 < NewScObjectNoCtorFull) {
    if (ProfiledInitRootFld < OVar2) {
      if (uVar18 != 0x99 && ProfiledLdElemI_A < OVar2) {
        if (uVar18 == 0xb0 || OVar2 < LdBaseFncProto) {
          if (OVar2 - 0xa4 < 2) {
            if (pOVar3 == (Opnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar12 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                                 ,0x175,"(dstOpnd != nullptr)","dstOpnd != nullptr");
              if (!bVar9) goto LAB_004a186c;
              *puVar12 = 0;
            }
            pIVar16 = IR::Opnd::AsIndirOpnd(instr->m_src1);
            KillLiveElems(this,pIVar16,(Opnd *)0x0,bv,inGlobOpt,instr->m_func);
            return;
          }
          if ((uVar18 == 0x9a) || (uVar18 == 0x9c)) goto LAB_004a1674;
        }
        else if (uVar18 - 0xb1 < 3) goto switchD_004a10a6_caseD_15a;
        goto switchD_004a10a6_caseD_158;
      }
      if (3 < OVar2 - 0x80) {
        if (OVar2 - 0x88 < 2) {
LAB_004a0f6e:
          if ((inGlobOpt) &&
             (KillObjectHeaderInlinedTypeSyms(this,this->currentBlock,false,0xffffffff),
             this->objectTypeSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
            if ((this->currentBlock->globOptData).maybeWrittenTypeSyms ==
                (BVSparse<Memory::JitArenaAllocator> *)0x0) {
              pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)
                        new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3f1274);
              pJVar5 = this->alloc;
              pBVar13->head = (Type_conflict)0x0;
              pBVar13->lastFoundIndex = (Type_conflict)0x0;
              pBVar13->alloc = pJVar5;
              pBVar13->lastUsedNodePrevNextField = (Type)pBVar13;
              (this->currentBlock->globOptData).maybeWrittenTypeSyms = pBVar13;
            }
            BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                      ((this->currentBlock->globOptData).maybeWrittenTypeSyms,this->objectTypeSyms);
          }
          goto LAB_004a1255;
        }
        if (1 < uVar18 - 0x8a) goto switchD_004a10a6_caseD_158;
      }
      pOVar3 = instr->m_src1;
      OVar7 = IR::Opnd::GetKind(pOVar3);
      if (OVar7 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar9) goto LAB_004a186c;
        *puVar12 = 0;
      }
      pSVar4 = (Sym *)pOVar3[1]._vptr_Opnd;
      if (pSVar4->m_kind != SymKindProperty) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
        if (!bVar9) goto LAB_004a186c;
        *puVar12 = 0;
      }
      KillLiveFields(this,*(BVSparse<Memory::JitArenaAllocator> **)&pSVar4[1].m_id,bv);
joined_r0x004a0f10:
      if (!inGlobOpt) {
        return;
      }
      pPVar15 = Sym::AsPropertySym(pSVar4);
      AddToPropertiesWrittenTo(this,pPVar15->m_propertyId);
      goto LAB_004a175f;
    }
    if (OVar2 < StRootFld) {
      if (3 < OVar2 - 0x53) {
        if (OVar2 == InitClassMember) goto switchD_004a10a6_caseD_152;
        if (uVar18 != 0x70) goto switchD_004a10a6_caseD_158;
      }
LAB_004a1255:
      if (pOVar3 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                           ,0x1bc,"(dstOpnd != nullptr)","dstOpnd != nullptr");
        if (!bVar9) goto LAB_004a186c;
        *puVar12 = 0;
      }
      OVar7 = IR::Opnd::GetKind(pOVar3);
      if (OVar7 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar9) goto LAB_004a186c;
        *puVar12 = 0;
      }
      pSVar4 = (Sym *)pOVar3[1]._vptr_Opnd;
      if (inGlobOpt) {
        if (pSVar4->m_kind != SymKindProperty) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
          if (!bVar9) goto LAB_004a186c;
          *puVar12 = 0;
        }
        AddToPropertiesWrittenTo(this,*(PropertyId *)&pSVar4[1]._vptr_Sym);
        if (pSVar4->m_kind != SymKindProperty) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
          if (!bVar9) goto LAB_004a186c;
          *puVar12 = 0;
        }
        if ((*(int *)&pSVar4[1]._vptr_Sym == 0x18e) ||
           (pPVar15 = Sym::AsPropertySym(pSVar4), pPVar15->m_propertyId == 0x178))
        goto switchD_004a179e_caseD_1a9;
      }
      bVar9 = IR::Instr::CallsAccessor(instr,(PropertySymOpnd *)0x0);
      if (!bVar9) {
        if (pSVar4->m_kind != SymKindProperty) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
          if (!bVar9) {
LAB_004a186c:
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          *puVar12 = 0;
        }
        pBVar13 = *(BVSparse<Memory::JitArenaAllocator> **)&pSVar4[1].m_id;
LAB_004a1640:
        KillLiveFields(this,pBVar13,bv);
        return;
      }
      goto switchD_004a179e_caseD_1a9;
    }
    if (OVar2 < StRootFldStrict) {
      if ((OVar2 == StRootFld) || (OVar2 == StFldStrict)) goto LAB_004a1255;
    }
    else if ((OVar2 == StRootFldStrict) || ((OVar2 == InitFld || (OVar2 == InitRootFld))))
    goto LAB_004a1255;
    goto switchD_004a10a6_caseD_158;
  }
  if (CallIDynamicSpread < OVar2) {
    if (uVar18 != 0x22b && Coerce_StrOrRegex < OVar2) {
      if (OVar2 - 0x249 < 2) {
        bVar9 = IR::Instr::UsesAllFields(instr);
        if (bVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                             ,0x1e3,"(!instr->UsesAllFields())","!instr->UsesAllFields()");
          if (!bVar9) goto LAB_004a186c;
          *puVar12 = 0;
        }
        KillLiveFields(this,this->argumentsEquivBv,bv);
        pBVar13 = this->callerEquivBv;
        goto LAB_004a1640;
      }
      if (1 < OVar2 - 0x269) {
        if (uVar18 == 0x22c) {
LAB_004a1674:
          if (pOVar3 == (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar12 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                               ,0x160,"(dstOpnd != nullptr)","dstOpnd != nullptr");
            if (!bVar9) goto LAB_004a186c;
            *puVar12 = 0;
          }
          KillLiveFields(this,this->lengthEquivBv,bv);
switchD_004a10a6_caseD_154:
          pIVar16 = IR::Opnd::AsIndirOpnd(pOVar3);
          KillLiveElems(this,pIVar16,instr->m_src1,bv,inGlobOpt,instr->m_func);
          if (!inGlobOpt) {
            return;
          }
          KillObjectHeaderInlinedTypeSyms(this,this->currentBlock,false,0xffffffff);
          return;
        }
        goto switchD_004a10a6_caseD_158;
      }
      if (instr->m_func->thisOrParentInlinerHasArguments != true) {
        KillLiveFields(this,this->lengthEquivBv,bv);
        goto switchD_004a10a6_caseD_157;
      }
      goto LAB_004a114a;
    }
    if (LdSlotArr < OVar2) {
      if (OVar2 - 0x1f7 < 2) goto LAB_004a1255;
      if (uVar18 == 0x215) goto switchD_004a10a6_caseD_157;
switchD_004a10a6_caseD_158:
      bVar9 = IR::Instr::UsesAllFields(instr);
      if (!bVar9) {
        return;
      }
switchD_004a179e_caseD_1a9:
      KillAllFields(this,bv);
      return;
    }
    if (OVar2 != CallDirect) {
      if (uVar18 == 0x1e9) {
        if (instr->m_src1 == (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                             ,0x239,"(instr->GetSrc1())","instr->GetSrc1()");
          if (!bVar9) goto LAB_004a186c;
          *puVar12 = 0;
        }
        pOVar3 = instr->m_src1;
        iVar11 = (*this->func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x19])();
        bVar9 = IR::AddrOpnd::IsEqualAddr(pOVar3,(void *)CONCAT44(extraout_var,iVar11));
        if (!inGlobOpt || bVar9) {
          return;
        }
        goto LAB_004a175f;
      }
      goto switchD_004a10a6_caseD_158;
    }
    pHVar17 = IR::Opnd::AsHelperCallOpnd(instr->m_src1);
    switch(pHVar17->m_fnHelper) {
    case HelperArray_Shift:
    case HelperArray_Splice:
    case HelperArray_Unshift:
      if ((this->lengthEquivBv != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
         (instr->m_func->thisOrParentInlinerHasArguments == false)) {
        KillLiveFields(this,this->lengthEquivBv,bv);
      }
    case HelperArray_Reverse:
      if (instr->m_func->thisOrParentInlinerHasArguments == true) {
LAB_004a114a:
        KillAllFields(this,bv);
        this->func->anyPropertyMayBeWrittenTo = true;
      }
      else {
switchD_004a10a6_caseD_157:
        if (inGlobOpt) {
LAB_004a175f:
          KillAllObjectTypes(this,bv);
          return;
        }
      }
      break;
    case HelperArray_IsArray:
    case HelperString_At:
    case HelperString_Concat:
    case HelperString_CharCodeAt:
    case HelperString_CharAt:
    case HelperString_FromCharCode:
    case HelperString_FromCodePoint:
    case HelperString_IndexOf:
    case HelperString_LastIndexOf:
    case HelperString_Link:
    case HelperString_LocaleCompare:
    case HelperString_Slice:
    case HelperString_Substr:
    case HelperString_Substring:
    case HelperString_ToLocaleLowerCase:
    case HelperString_ToLocaleUpperCase:
    case HelperString_ToLowerCase:
    case HelperString_ToUpperCase:
    case HelperString_Trim:
    case HelperString_TrimLeft:
    case HelperString_TrimRight:
    case HelperString_GetSz:
    case HelperString_PadStart:
    case HelperString_PadEnd:
    case HelperGlobalObject_ParseInt:
    case HelperObject_HasOwnProperty:
    case HelperObject_HasOwn:
      break;
    case HelperString_Match:
    case HelperString_Replace:
    case HelperString_Search:
    case HelperString_Split:
    case HelperRegExp_SplitResultUsed:
    case HelperRegExp_SplitResultUsedAndMayBeTemp:
    case HelperRegExp_SplitResultNotUsed:
    case HelperRegExp_MatchResultUsed:
    case HelperRegExp_MatchResultUsedAndMayBeTemp:
    case HelperRegExp_MatchResultNotUsed:
    case HelperRegExp_Exec:
    case HelperRegExp_ExecResultUsed:
    case HelperRegExp_ExecResultUsedAndMayBeTemp:
    case HelperRegExp_ExecResultNotUsed:
    case HelperRegExp_ReplaceStringResultUsed:
    case HelperRegExp_ReplaceStringResultNotUsed:
    case HelperRegExp_SymbolSearch:
      goto switchD_004a179e_caseD_1a9;
    default:
      if (pHVar17->m_fnHelper != HelperArray_Concat) {
        return;
      }
    case HelperArray_Slice:
      if ((inGlobOpt) && (this->objectTypeSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
        if ((this->currentBlock->globOptData).maybeWrittenTypeSyms ==
            (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)
                    new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3f1274);
          pJVar5 = this->alloc;
          pBVar13->head = (Type_conflict)0x0;
          pBVar13->lastFoundIndex = (Type_conflict)0x0;
          pBVar13->alloc = pJVar5;
          pBVar13->lastUsedNodePrevNextField = (Type)pBVar13;
          (this->currentBlock->globOptData).maybeWrittenTypeSyms = pBVar13;
        }
        BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                  ((this->currentBlock->globOptData).maybeWrittenTypeSyms,this->objectTypeSyms);
        return;
      }
    }
    return;
  }
  switch(OVar2) {
  case InitSetFld:
  case InitGetFld:
switchD_004a10a6_caseD_152:
    pSVar14 = IR::Opnd::AsSymOpnd(instr->m_dst);
    pSVar4 = pSVar14->m_sym;
    pPVar15 = Sym::AsPropertySym(pSVar4);
    KillLiveFields(this,pPVar15->m_propertyEquivSet,bv);
    goto joined_r0x004a0f10;
  case InitSetElemI:
  case InitGetElemI:
  case InitComputedProperty:
    goto switchD_004a10a6_caseD_154;
  case InitProto:
    break;
  case LdChakraLib:
  case LdImportMeta:
    goto switchD_004a10a6_caseD_158;
  case LdLetHeapArgsCached:
switchD_004a10a6_caseD_15a:
    if (!inGlobOpt) {
      return;
    }
    pBVar13 = this->slotSyms;
    goto LAB_004a1640;
  default:
    uVar18 = OVar2 - 0x118;
    if (uVar18 < 0x1c) {
      if ((3U >> (uVar18 & 0x1f) & 1) != 0) goto switchD_004a10a6_caseD_152;
      if ((0x28000U >> (uVar18 & 0x1f) & 1) != 0) goto LAB_004a1255;
      if ((0xc000000U >> (uVar18 & 0x1f) & 1) != 0) goto LAB_004a0f6e;
    }
    if (OVar2 != NewScObjectNoCtorFull) goto switchD_004a10a6_caseD_158;
  }
  goto switchD_004a10a6_caseD_157;
}

Assistant:

void
GlobOpt::ProcessFieldKills(IR::Instr *instr, BVSparse<JitArenaAllocator> *bv, bool inGlobOpt)
{
    if (bv->IsEmpty() && (!this->IsLoopPrePass() || this->rootLoopPrePass->allFieldsKilled))
    {
        return;
    }

    if (instr->m_opcode == Js::OpCode::FromVar || instr->m_opcode == Js::OpCode::Conv_Prim)
    {
        return;
    }

    IR::Opnd * dstOpnd = instr->GetDst();
    if (dstOpnd)
    {
        if (dstOpnd->IsRegOpnd())
        {
            Sym * sym = dstOpnd->AsRegOpnd()->m_sym;
            if (sym->IsStackSym())
            {
                KillLiveFields(sym->AsStackSym(), bv);
            }
        }
        else if (dstOpnd->IsSymOpnd())
        {
            Sym * sym = dstOpnd->AsSymOpnd()->m_sym;
            if (sym->IsStackSym())
            {
                KillLiveFields(sym->AsStackSym(), bv);
            }
            else
            {
                Assert(sym->IsPropertySym());
                if (instr->m_opcode == Js::OpCode::InitLetFld || instr->m_opcode == Js::OpCode::InitConstFld || instr->m_opcode == Js::OpCode::InitFld)
                {
                    // These can grow the aux slot of the activation object.
                    // We need to kill the slot array sym as well.
                    PropertySym * slotArraySym = PropertySym::Find(sym->AsPropertySym()->m_stackSym->m_id,
                        (Js::DynamicObject::GetOffsetOfAuxSlots())/sizeof(Js::Var) /*, PropertyKindSlotArray */, instr->m_func);
                    if (slotArraySym)
                    {
                        bv->Clear(slotArraySym->m_id);
                    }
                }
            }
        }
    }

    if (bv->IsEmpty() && (!this->IsLoopPrePass() || this->rootLoopPrePass->allFieldsKilled))
    {
        return;
    }

    Sym *sym;
    IR::JnHelperMethod fnHelper;
    switch(instr->m_opcode)
    {
    case Js::OpCode::StElemC:
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        Assert(dstOpnd != nullptr);
        KillLiveFields(this->lengthEquivBv, bv);
        KillLiveElems(dstOpnd->AsIndirOpnd(), instr->GetSrc1(), bv, inGlobOpt, instr->m_func);
        if (inGlobOpt)
        {
            KillObjectHeaderInlinedTypeSyms(this->currentBlock, false);
        }
        break;

    case Js::OpCode::InitComputedProperty:
    case Js::OpCode::InitGetElemI:
    case Js::OpCode::InitSetElemI:
        KillLiveElems(dstOpnd->AsIndirOpnd(), instr->GetSrc1(), bv, inGlobOpt, instr->m_func);
        if (inGlobOpt)
        {
            KillObjectHeaderInlinedTypeSyms(this->currentBlock, false);
        }
        break;

    case Js::OpCode::DeleteElemI_A:
    case Js::OpCode::DeleteElemIStrict_A:
        Assert(dstOpnd != nullptr);
        KillLiveElems(instr->GetSrc1()->AsIndirOpnd(), nullptr, bv, inGlobOpt, instr->m_func);
        break;

    case Js::OpCode::DeleteFld:
    case Js::OpCode::DeleteRootFld:
    case Js::OpCode::DeleteFldStrict:
    case Js::OpCode::DeleteRootFldStrict:
    case Js::OpCode::ScopedDeleteFld:
    case Js::OpCode::ScopedDeleteFldStrict:
        sym = instr->GetSrc1()->AsSymOpnd()->m_sym;
        KillLiveFields(sym->AsPropertySym(), bv);
        if (inGlobOpt)
        {
            AddToPropertiesWrittenTo(sym->AsPropertySym()->m_propertyId);
            this->KillAllObjectTypes(bv);
        }
        break;

    case Js::OpCode::InitSetFld:
    case Js::OpCode::InitGetFld:
    case Js::OpCode::InitClassMember:
    case Js::OpCode::InitClassMemberGet:
    case Js::OpCode::InitClassMemberSet:
        sym = instr->GetDst()->AsSymOpnd()->m_sym;
        KillLiveFields(sym->AsPropertySym(), bv);
        if (inGlobOpt)
        {
            AddToPropertiesWrittenTo(sym->AsPropertySym()->m_propertyId);
            this->KillAllObjectTypes(bv);
        }
        break;

    case Js::OpCode::ConsoleScopedStFld:
    case Js::OpCode::ConsoleScopedStFldStrict:
    case Js::OpCode::ScopedStFld:
    case Js::OpCode::ScopedStFldStrict:
        // This is already taken care of for FastFld opcodes

        if (inGlobOpt)
        {
            KillObjectHeaderInlinedTypeSyms(this->currentBlock, false);
            if (this->objectTypeSyms)
            {
                if (this->currentBlock->globOptData.maybeWrittenTypeSyms == nullptr)
                {
                    this->currentBlock->globOptData.maybeWrittenTypeSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
                }
                this->currentBlock->globOptData.maybeWrittenTypeSyms->Or(this->objectTypeSyms);
            }
        }

        // fall through

    case Js::OpCode::InitFld:
    case Js::OpCode::InitConstFld:
    case Js::OpCode::InitLetFld:
    case Js::OpCode::InitRootFld:
    case Js::OpCode::InitRootConstFld:
    case Js::OpCode::InitRootLetFld:
#if !FLOATVAR
    case Js::OpCode::StSlotBoxTemp:
#endif
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
    case Js::OpCode::StSuperFld:
    case Js::OpCode::StSuperFldStrict:
        Assert(dstOpnd != nullptr);
        sym = dstOpnd->AsSymOpnd()->m_sym;
        if (inGlobOpt)
        {
            AddToPropertiesWrittenTo(sym->AsPropertySym()->m_propertyId);
        }
        if ((inGlobOpt && (sym->AsPropertySym()->m_propertyId == Js::PropertyIds::valueOf || sym->AsPropertySym()->m_propertyId == Js::PropertyIds::toString)) ||
            instr->CallsAccessor())
        {
            // If overriding valueof/tostring, we might have expected a previous LdFld to bailout on implicitCalls but didn't.
            // CSE's for example would have expected a bailout. Clear all fields to prevent optimizing across.
            this->KillAllFields(bv);
        }
        else
        {
            KillLiveFields(sym->AsPropertySym(), bv);
        }
        break;

    case Js::OpCode::InlineArrayPush:
    case Js::OpCode::InlineArrayPop:
        if(instr->m_func->GetThisOrParentInlinerHasArguments())
        {
            this->KillAllFields(bv);
            this->SetAnyPropertyMayBeWrittenTo();
        }
        else
        {
            KillLiveFields(this->lengthEquivBv, bv);
            if (inGlobOpt)
            {
                // Deleting an item, or pushing a property to a non-array, may change object layout
                KillAllObjectTypes(bv);
            }
        }
        break;

    case Js::OpCode::InlineeStart:
    case Js::OpCode::InlineeEnd:
        Assert(!instr->UsesAllFields());

        // Kill all live 'arguments' and 'caller' fields, as 'inlineeFunction.arguments' and 'inlineeFunction.caller'
        // cannot be copy-propped across different instances of the same inlined function.
        KillLiveFields(argumentsEquivBv, bv);
        KillLiveFields(callerEquivBv, bv);
        break;

    case Js::OpCode::CallDirect:
        fnHelper = instr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper;

        switch (fnHelper)
        {
            case IR::JnHelperMethod::HelperArray_Shift:
            case IR::JnHelperMethod::HelperArray_Splice:
            case IR::JnHelperMethod::HelperArray_Unshift:
                // Kill length field for built-ins that can update it.
                if (nullptr != this->lengthEquivBv)
                {
                    // If has arguments, all fields are killed in fall through
                    if (!instr->m_func->GetThisOrParentInlinerHasArguments())
                    {
                        KillLiveFields(this->lengthEquivBv, bv);
                    }
                }
                // fall through

            case IR::JnHelperMethod::HelperArray_Reverse:
                if (instr->m_func->GetThisOrParentInlinerHasArguments())
                {
                    this->KillAllFields(bv);
                    this->SetAnyPropertyMayBeWrittenTo();
                }
                else if (inGlobOpt)
                {
                    // Deleting an item may change object layout
                    KillAllObjectTypes(bv);
                }
                break;

            case IR::JnHelperMethod::HelperArray_Slice:
            case IR::JnHelperMethod::HelperArray_Concat:
                if (inGlobOpt && this->objectTypeSyms)
                {
                    if (this->currentBlock->globOptData.maybeWrittenTypeSyms == nullptr)
                    {
                        this->currentBlock->globOptData.maybeWrittenTypeSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
                    }
                    this->currentBlock->globOptData.maybeWrittenTypeSyms->Or(this->objectTypeSyms);
                }
                break;

            case IR::JnHelperMethod::HelperRegExp_Exec:
            case IR::JnHelperMethod::HelperRegExp_ExecResultNotUsed:
            case IR::JnHelperMethod::HelperRegExp_ExecResultUsed:
            case IR::JnHelperMethod::HelperRegExp_ExecResultUsedAndMayBeTemp:
            case IR::JnHelperMethod::HelperRegExp_MatchResultNotUsed:
            case IR::JnHelperMethod::HelperRegExp_MatchResultUsed:
            case IR::JnHelperMethod::HelperRegExp_MatchResultUsedAndMayBeTemp:
            case IR::JnHelperMethod::HelperRegExp_ReplaceStringResultUsed:
            case IR::JnHelperMethod::HelperRegExp_ReplaceStringResultNotUsed:
            case IR::JnHelperMethod::HelperRegExp_SplitResultNotUsed:
            case IR::JnHelperMethod::HelperRegExp_SplitResultUsed:
            case IR::JnHelperMethod::HelperRegExp_SplitResultUsedAndMayBeTemp:
            case IR::JnHelperMethod::HelperRegExp_SymbolSearch:
            case IR::JnHelperMethod::HelperString_Match:
            case IR::JnHelperMethod::HelperString_Search:
            case IR::JnHelperMethod::HelperString_Split:
            case IR::JnHelperMethod::HelperString_Replace:
                // Consider: We may not need to kill all fields here.
                // We need to kill all the built-in properties that can be written, though, and there are a lot of those.
                this->KillAllFields(bv);
                break;
        }
        break;

    case Js::OpCode::LdHeapArguments:
    case Js::OpCode::LdLetHeapArguments:
    case Js::OpCode::LdHeapArgsCached:
    case Js::OpCode::LdLetHeapArgsCached:
        if (inGlobOpt) {
            this->KillLiveFields(this->slotSyms, bv);
        }
        break;

    case Js::OpCode::NewClassProto:
        Assert(instr->GetSrc1());
        if (IR::AddrOpnd::IsEqualAddr(instr->GetSrc1(), (void*)func->GetScriptContextInfo()->GetObjectPrototypeAddr()))
        {
            // No extends operand, the proto parent is the Object prototype
            break;
        }
        // Fall through
    case Js::OpCode::InitProto:
    case Js::OpCode::NewScObjectNoCtor:
    case Js::OpCode::NewScObjectNoCtorFull:
        if (inGlobOpt)
        {
            // Opcodes that make an object into a prototype may break object-header-inlining and final type opt.
            // Kill all known object layouts.
            KillAllObjectTypes(bv);
        }
        break;

    default:
        if (instr->UsesAllFields())
        {
            // This also kills all property type values, as the same bit-vector tracks those stack syms.
            this->KillAllFields(bv);
        }
        break;
    }
}